

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O2

int Ivy_ManFindBoolCut(Ivy_Man_t *p,Ivy_Obj_t *pRoot,Vec_Ptr_t *vFront,Vec_Ptr_t *vVolume,
                      Vec_Ptr_t *vLeaves)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Ivy_Obj_t *pObj;
  void *pvVar4;
  ulong uVar5;
  Ivy_Obj_t *pIVar6;
  Ivy_Obj_t *pPivot;
  ulong uVar7;
  Ivy_Obj_t *pFanin1;
  Ivy_Obj_t *pFanin0;
  uint local_58;
  int local_54;
  Ivy_Obj_t *local_50;
  Ivy_Obj_t *local_48;
  Ivy_Man_t *local_40;
  ulong local_38;
  
  if (((ulong)pRoot & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x135,
                  "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  vFront->nSize = 0;
  vVolume->nSize = 0;
  local_40 = p;
  iVar1 = Ivy_ObjIsMuxType(pRoot);
  if (iVar1 == 0) {
    pFanin0 = (Ivy_Obj_t *)((ulong)pRoot->pFanin0 & 0xfffffffffffffffe);
    pFanin1 = (Ivy_Obj_t *)((ulong)pRoot->pFanin1 & 0xfffffffffffffffe);
    local_50 = (Ivy_Obj_t *)0x0;
  }
  else {
    local_50 = Ivy_ObjRecognizeMux(pRoot,&pFanin0,&pFanin1);
  }
  pFanin0->field_0x8 = pFanin0->field_0x8 | 0x10;
  Vec_PtrPush(vFront,pFanin0);
  Vec_PtrPush(vVolume,pFanin0);
  *(uint *)&pFanin1->field_0x8 = *(uint *)&pFanin1->field_0x8 | 0x20;
  Vec_PtrPush(vFront,pFanin1);
  Vec_PtrPush(vVolume,pFanin1);
  uVar3 = *(uint *)&pRoot->field_0x8;
  local_58 = uVar3 >> 0xb;
  uVar5 = (ulong)pRoot->pFanin0 & 0xfffffffffffffffe;
  uVar7 = (ulong)pRoot->pFanin1 & 0xfffffffffffffffe;
  if (*(uint *)(uVar7 + 8) >> 0xb < *(uint *)(uVar5 + 8) >> 0xb) {
    uVar7 = uVar5;
  }
  if (local_58 != (*(uint *)(uVar7 + 8) >> 0xb) + (uint)((uVar3 & 0xf) == 6) + 1) {
    __assert_fail("Ivy_ObjLevel(pRoot) == Ivy_ObjLevelNew(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x14a,
                  "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  local_54 = local_58 - 10;
  if (uVar3 < 0x6000) {
    local_54 = 1;
  }
  pObj = (Ivy_Obj_t *)0x0;
  local_48 = pRoot;
  do {
    local_38 = (ulong)local_58;
    if ((int)local_58 <= local_54) {
      return 0;
    }
    local_58 = local_58 - 1;
    iVar1 = 0;
LAB_007454d6:
    for (; iVar2 = vFront->nSize, iVar1 < iVar2; iVar1 = iVar1 + 1) {
      pObj = (Ivy_Obj_t *)Vec_PtrEntry(vFront,iVar1);
      if (*(uint *)&pObj->field_0x8 >> 0xb == local_58) {
        iVar2 = vFront->nSize;
        break;
      }
    }
  } while (iVar1 == iVar2);
  uVar3 = *(uint *)&pObj->field_0x8;
  if ((int)local_38 <= (int)(uVar3 >> 0xb)) {
    __assert_fail("(int)pObj->Level <= Lev",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x157,
                  "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  if (((uVar3 >> 5 ^ uVar3 >> 4) & 1) == 0) {
    __assert_fail("pObj->fMarkA ^ pObj->fMarkB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x158,
                  "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  Vec_PtrRemove(vFront,pObj);
  pFanin0 = (Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
  if ((pFanin0->field_0x8 & 0x30) == 0) {
    Vec_PtrPush(vFront,pFanin0);
    Vec_PtrPush(vVolume,pFanin0);
  }
  uVar3 = *(uint *)&pObj->field_0x8;
  if ((uVar3 & 0x10) != 0) {
    *(uint *)&pFanin0->field_0x8 = *(uint *)&pFanin0->field_0x8 | 0x10;
    uVar3 = *(uint *)&pObj->field_0x8;
  }
  if ((uVar3 & 0x20) != 0) {
    *(uint *)&pFanin0->field_0x8 = *(uint *)&pFanin0->field_0x8 | 0x20;
    uVar3 = *(uint *)&pObj->field_0x8;
  }
  pIVar6 = pFanin0;
  if ((uVar3 & 0xf) == 7) {
LAB_007455f9:
    iVar1 = 0;
    pPivot = pIVar6;
    if ((~*(uint *)&pIVar6->field_0x8 & 0x30) != 0) goto LAB_007454d6;
  }
  else {
    pFanin1 = (Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    if ((pFanin1->field_0x8 & 0x30) == 0) {
      Vec_PtrPush(vFront,pFanin1);
      Vec_PtrPush(vVolume,pFanin1);
      uVar3 = *(uint *)&pObj->field_0x8;
    }
    if ((uVar3 & 0x10) != 0) {
      *(uint *)&pFanin1->field_0x8 = *(uint *)&pFanin1->field_0x8 | 0x10;
      uVar3 = *(uint *)&pObj->field_0x8;
    }
    if ((uVar3 & 0x20) != 0) {
      *(uint *)&pFanin1->field_0x8 = *(uint *)&pFanin1->field_0x8 | 0x20;
    }
    pIVar6 = pFanin1;
    pPivot = pFanin0;
    if ((~*(uint *)&pFanin0->field_0x8 & 0x30) != 0) goto LAB_007455f9;
  }
  if ((local_50 != (Ivy_Obj_t *)0x0) && ((local_50->field_0x8 & 0x30) == 0)) {
    Vec_PtrPush(vFront,local_50);
  }
  for (iVar1 = 0; iVar1 < vVolume->nSize; iVar1 = iVar1 + 1) {
    pObj = (Ivy_Obj_t *)Vec_PtrEntry(vVolume,iVar1);
    pObj->field_0x8 = pObj->field_0x8 & 0xcf;
  }
  for (iVar1 = 0; iVar1 < vFront->nSize; iVar1 = iVar1 + 1) {
    pObj = (Ivy_Obj_t *)Vec_PtrEntry(vFront,iVar1);
    pObj->field_0x8 = pObj->field_0x8 | 0x10;
  }
  vLeaves->nSize = 0;
  vVolume->nSize = 0;
  iVar1 = Ivy_ManFindBoolCut_rec(local_40,local_48,vLeaves,vVolume,pPivot);
  if (iVar1 == 0) {
    __assert_fail("RetValue == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCut.c"
                  ,0x19f,
                  "int Ivy_ManFindBoolCut(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  for (iVar1 = 0; iVar1 < vFront->nSize; iVar1 = iVar1 + 1) {
    pObj = (Ivy_Obj_t *)Vec_PtrEntry(vFront,iVar1);
    pObj->field_0x8 = pObj->field_0x8 & 0xef;
  }
  for (iVar1 = 0; iVar1 < vVolume->nSize; iVar1 = iVar1 + 1) {
    pObj = (Ivy_Obj_t *)Vec_PtrEntry(vVolume,iVar1);
    pObj->field_0x8 = pObj->field_0x8 | 0x10;
  }
  do {
    iVar1 = 0;
LAB_007456e2:
    do {
      do {
        iVar2 = vLeaves->nSize;
        if (iVar1 < iVar2) {
          pObj = (Ivy_Obj_t *)Vec_PtrEntry(vLeaves,iVar1);
          uVar3 = Ivy_ManFindBoolCutCost(pObj);
          if (1 < uVar3) {
            iVar1 = iVar1 + 1;
            goto LAB_007456e2;
          }
          iVar2 = vLeaves->nSize;
        }
        if (iVar1 == iVar2) {
          for (iVar1 = 0; iVar1 < vVolume->nSize; iVar1 = iVar1 + 1) {
            pvVar4 = Vec_PtrEntry(vVolume,iVar1);
            *(byte *)((long)pvVar4 + 8) = *(byte *)((long)pvVar4 + 8) & 0xef;
          }
          return 1;
        }
        Vec_PtrRemove(vLeaves,pObj);
        pFanin0 = (Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
        if ((*(uint *)&pFanin0->field_0x8 & 0x10) == 0) {
          *(uint *)&pFanin0->field_0x8 = *(uint *)&pFanin0->field_0x8 | 0x10;
          Vec_PtrPush(vVolume,pFanin0);
          Vec_PtrPush(vLeaves,pFanin0);
        }
        iVar1 = 0;
      } while ((*(uint *)&pObj->field_0x8 & 0xf) == 7);
      pFanin1 = (Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    } while ((*(uint *)&pFanin1->field_0x8 & 0x10) != 0);
    *(uint *)&pFanin1->field_0x8 = *(uint *)&pFanin1->field_0x8 | 0x10;
    Vec_PtrPush(vVolume,pFanin1);
    Vec_PtrPush(vLeaves,pFanin1);
  } while( true );
}

Assistant:

int Ivy_ManFindBoolCut( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Vec_Ptr_t * vFront, Vec_Ptr_t * vVolume, Vec_Ptr_t * vLeaves )
{
    Ivy_Obj_t * pObj = NULL; // Suppress "might be used uninitialized"
    Ivy_Obj_t * pFaninC, * pFanin0, * pFanin1, * pPivot;
    int RetValue, LevelLimit, Lev, k;
    assert( !Ivy_IsComplement(pRoot) );
    // clear the frontier and collect the nodes
    Vec_PtrClear( vFront );
    Vec_PtrClear( vVolume );
    if ( Ivy_ObjIsMuxType(pRoot) )
        pFaninC = Ivy_ObjRecognizeMux( pRoot, &pFanin0, &pFanin1 );
    else
    {
        pFaninC = NULL;
        pFanin0 = Ivy_ObjFanin0(pRoot);
        pFanin1 = Ivy_ObjFanin1(pRoot); 
    }
    // start cone A
    pFanin0->fMarkA = 1;
    Vec_PtrPush( vFront, pFanin0 );
    Vec_PtrPush( vVolume, pFanin0 );
    // start cone B
    pFanin1->fMarkB = 1;
    Vec_PtrPush( vFront, pFanin1 );
    Vec_PtrPush( vVolume, pFanin1 );
    // iteratively expand until the common node (pPivot) is found or limit is reached
    assert( Ivy_ObjLevel(pRoot) == Ivy_ObjLevelNew(pRoot) );
    pPivot = NULL;
    LevelLimit = IVY_MAX( Ivy_ObjLevel(pRoot) - 10, 1 );
    for ( Lev = Ivy_ObjLevel(pRoot) - 1; Lev >= LevelLimit; Lev-- )
    {
        while ( 1 )
        {
            // find the next node to expand on this level
            Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, k )
                if ( (int)pObj->Level == Lev )
                    break;
            if ( k == Vec_PtrSize(vFront) )
                break;
            assert( (int)pObj->Level <= Lev );
            assert( pObj->fMarkA ^ pObj->fMarkB );
            // remove the old node
            Vec_PtrRemove( vFront, pObj );

            // expand this node
            pFanin0 = Ivy_ObjFanin0(pObj);
            if ( !pFanin0->fMarkA && !pFanin0->fMarkB )
            {
                Vec_PtrPush( vFront, pFanin0 );
                Vec_PtrPush( vVolume, pFanin0 );
            }
            // mark the new nodes
            if ( pObj->fMarkA )
                pFanin0->fMarkA = 1; 
            if ( pObj->fMarkB )
                pFanin0->fMarkB = 1; 

            if ( Ivy_ObjIsBuf(pObj) )
            {
                if ( pFanin0->fMarkA && pFanin0->fMarkB )
                {
                    pPivot = pFanin0;
                    break;
                }
                continue;
            }

            // expand this node
            pFanin1 = Ivy_ObjFanin1(pObj); 
            if ( !pFanin1->fMarkA && !pFanin1->fMarkB )
            {
                Vec_PtrPush( vFront, pFanin1 );
                Vec_PtrPush( vVolume, pFanin1 );
            }
            // mark the new nodes
            if ( pObj->fMarkA )
                pFanin1->fMarkA = 1; 
            if ( pObj->fMarkB )
                pFanin1->fMarkB = 1; 

            // consider if it is time to quit
            if ( pFanin0->fMarkA && pFanin0->fMarkB )
            {
                pPivot = pFanin0;
                break;
            }
            if ( pFanin1->fMarkA && pFanin1->fMarkB )
            {
                pPivot = pFanin1;
                break;
            }
        }
        if ( pPivot != NULL )
            break;
    }
    if ( pPivot == NULL )
        return 0;
    // if the MUX control is defined, it should not be
    if ( pFaninC && !pFaninC->fMarkA && !pFaninC->fMarkB )
        Vec_PtrPush( vFront, pFaninC );
    // clean the markings
    Vec_PtrForEachEntry( Ivy_Obj_t *, vVolume, pObj, k )
        pObj->fMarkA = pObj->fMarkB = 0;

    // mark the nodes on the frontier (including the pivot)
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, k )
        pObj->fMarkA = 1;
    // cut exists, collect all the nodes on the shortest path to the pivot
    Vec_PtrClear( vLeaves );
    Vec_PtrClear( vVolume );
    RetValue = Ivy_ManFindBoolCut_rec( p, pRoot, vLeaves, vVolume, pPivot );
    assert( RetValue == 1 );
    // unmark the nodes on the frontier (including the pivot)
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFront, pObj, k )
        pObj->fMarkA = 0;

    // mark the nodes in the volume
    Vec_PtrForEachEntry( Ivy_Obj_t *, vVolume, pObj, k )
        pObj->fMarkA = 1;
    // expand the cut without increasing its size
    while ( 1 )
    {
        Vec_PtrForEachEntry( Ivy_Obj_t *, vLeaves, pObj, k )
            if ( Ivy_ManFindBoolCutCost(pObj) < 2 )
                break;
        if ( k == Vec_PtrSize(vLeaves) )
            break;
        // the node can be expanded
        // remove the old node
        Vec_PtrRemove( vLeaves, pObj );
        // expand this node
        pFanin0 = Ivy_ObjFanin0(pObj);
        if ( !pFanin0->fMarkA )
        {
            pFanin0->fMarkA = 1;
            Vec_PtrPush( vVolume, pFanin0 );
            Vec_PtrPush( vLeaves, pFanin0 );
        }
        if ( Ivy_ObjIsBuf(pObj) )
            continue;
        // expand this node
        pFanin1 = Ivy_ObjFanin1(pObj);
        if ( !pFanin1->fMarkA )
        {
            pFanin1->fMarkA = 1;
            Vec_PtrPush( vVolume, pFanin1 );
            Vec_PtrPush( vLeaves, pFanin1 );
        }        
    }
    // unmark the nodes in the volume
    Vec_PtrForEachEntry( Ivy_Obj_t *, vVolume, pObj, k )
        pObj->fMarkA = 0;
    return 1;
}